

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
~MatcherBase(MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> *this)

{
  MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> *this_local;
  
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00233b88;
  Destroy(this);
  MatcherDescriberInterface::~MatcherDescriberInterface(&this->super_MatcherDescriberInterface);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }